

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void MonitoredItem_delete(UA_Server *server,UA_MonitoredItem *monitoredItem)

{
  MonitoredItem_queuedValue *pMVar1;
  MonitoredItem_queuedValue **ppMVar2;
  UA_MonitoredItem *pUVar3;
  UA_MonitoredItem **ppUVar4;
  anon_struct_16_2_4dd83919_for_listEntry *paVar5;
  MonitoredItem_queuedValue *__ptr;
  
  MonitoredItem_unregisterSampleJob(server,monitoredItem);
  __ptr = (monitoredItem->queue).tqh_first;
  while (__ptr != (MonitoredItem_queuedValue *)0x0) {
    pMVar1 = (__ptr->listEntry).tqe_next;
    paVar5 = &pMVar1->listEntry;
    if (pMVar1 == (MonitoredItem_queuedValue *)0x0) {
      paVar5 = (anon_struct_16_2_4dd83919_for_listEntry *)&monitoredItem->queue;
    }
    ppMVar2 = (__ptr->listEntry).tqe_prev;
    paVar5->tqe_prev = ppMVar2;
    *ppMVar2 = pMVar1;
    UA_DataValue_deleteMembers(&__ptr->value);
    free(__ptr);
    __ptr = pMVar1;
  }
  monitoredItem->currentQueueSize = 0;
  pUVar3 = (monitoredItem->listEntry).le_next;
  ppUVar4 = (monitoredItem->listEntry).le_prev;
  if (pUVar3 != (UA_MonitoredItem *)0x0) {
    (pUVar3->listEntry).le_prev = ppUVar4;
  }
  *ppUVar4 = pUVar3;
  UA_String_deleteMembers(&monitoredItem->indexRange);
  UA_ByteString_deleteMembers(&monitoredItem->lastSampledValue);
  UA_NodeId_deleteMembers(&monitoredItem->monitoredNodeId);
  free(monitoredItem);
  return;
}

Assistant:

void MonitoredItem_delete(UA_Server *server, UA_MonitoredItem *monitoredItem) {
    MonitoredItem_unregisterSampleJob(server, monitoredItem);
    /* clear the queued samples */
    MonitoredItem_queuedValue *val, *val_tmp;
    TAILQ_FOREACH_SAFE(val, &monitoredItem->queue, listEntry, val_tmp) {
        TAILQ_REMOVE(&monitoredItem->queue, val, listEntry);
        UA_DataValue_deleteMembers(&val->value);
        UA_free(val);
    }
    monitoredItem->currentQueueSize = 0;
    LIST_REMOVE(monitoredItem, listEntry);
    UA_String_deleteMembers(&monitoredItem->indexRange);
    UA_ByteString_deleteMembers(&monitoredItem->lastSampledValue);
    UA_NodeId_deleteMembers(&monitoredItem->monitoredNodeId);
    UA_free(monitoredItem);
}